

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  d_derived_tbl *pdVar3;
  jpeg_source_mgr *pjVar4;
  boolean bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int bits_left;
  _func_void_j_decompress_ptr *get_buffer;
  int iVar12;
  int min_bits;
  uint uVar13;
  bitread_working_state br_state;
  savable_state state;
  
  pjVar1 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar1[3].decode_mcu != 0)) ||
     (bVar5 = process_restart(cinfo), bVar5 != 0)) {
    if (*(int *)((long)&pjVar1[3].start_pass + 4) == 0) {
      br_state.next_input_byte = cinfo->src->next_input_byte;
      br_state.bytes_in_buffer = cinfo->src->bytes_in_buffer;
      get_buffer = pjVar1[1].start_pass;
      bits_left = *(int *)&pjVar1[1].decode_mcu;
      state.last_dc_val[3] = *(int *)&pjVar1[3].start_pass;
      state._0_8_ = pjVar1[2].start_pass;
      state.last_dc_val._4_8_ = pjVar1[2].decode_mcu;
      br_state.cinfo = cinfo;
      for (lVar11 = 0; lVar11 < cinfo->blocks_in_MCU; lVar11 = lVar11 + 1) {
        paJVar2 = MCU_data[lVar11];
        pdVar3 = (d_derived_tbl *)(&pjVar1[10].decode_mcu)[lVar11];
        if (bits_left < 8) {
          bVar5 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,0);
          if (bVar5 == 0) {
            return 0;
          }
          iVar12 = 1;
          get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
          bits_left = br_state.bits_left;
          if (7 < br_state.bits_left) goto LAB_0023f6a9;
LAB_0023f6d4:
          uVar8 = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,bits_left,pdVar3,iVar12);
          get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
          bits_left = br_state.bits_left;
          if ((int)uVar8 < 0) goto LAB_0023f98f;
        }
        else {
LAB_0023f6a9:
          uVar10 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
          if (pdVar3->look_nbits[uVar10] == 0) {
            iVar12 = 9;
            goto LAB_0023f6d4;
          }
          uVar8 = (uint)pdVar3->look_sym[uVar10];
          bits_left = bits_left - pdVar3->look_nbits[uVar10];
        }
        pdVar3 = (d_derived_tbl *)(&pjVar1[0xf].decode_mcu)[lVar11];
        iVar12 = *(int *)((long)&pjVar1[0x14].decode_mcu + lVar11 * 4);
        if (iVar12 == 0) {
          if (uVar8 != 0) {
            if ((bits_left < (int)uVar8) &&
               (bVar5 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,uVar8),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               bits_left = br_state.bits_left, bVar5 == 0)) goto LAB_0023f98f;
            bits_left = bits_left - uVar8;
          }
          iVar7 = 1;
        }
        else {
          if (uVar8 == 0) {
            iVar7 = 0;
          }
          else {
            if ((bits_left < (int)uVar8) &&
               (bVar5 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,uVar8),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               bits_left = br_state.bits_left, bVar5 == 0)) goto LAB_0023f98f;
            bits_left = bits_left - uVar8;
            uVar13 = bmask[uVar8];
            uVar6 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & uVar13;
            if (bmask[uVar8 - 1] < (int)uVar6) {
              uVar13 = 0;
            }
            iVar7 = uVar6 - uVar13;
          }
          iVar7 = iVar7 + state.last_dc_val[cinfo->MCU_membership[lVar11]];
          state.last_dc_val[cinfo->MCU_membership[lVar11]] = iVar7;
          (*paJVar2)[0] = (JCOEF)iVar7;
          for (iVar7 = 1; iVar7 < iVar12; iVar7 = iVar7 + 1) {
            if (bits_left < 8) {
              bVar5 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,0);
              if (bVar5 == 0) {
                return 0;
              }
              min_bits = 1;
              get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
              bits_left = br_state.bits_left;
              if (7 < br_state.bits_left) goto LAB_0023f8ad;
LAB_0023f8d8:
              uVar8 = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,bits_left,pdVar3,min_bits)
              ;
              get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
              bits_left = br_state.bits_left;
              if ((int)uVar8 < 0) goto LAB_0023f98f;
            }
            else {
LAB_0023f8ad:
              uVar10 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
              if (pdVar3->look_nbits[uVar10] == 0) {
                min_bits = 9;
                goto LAB_0023f8d8;
              }
              uVar8 = (uint)pdVar3->look_sym[uVar10];
              bits_left = bits_left - pdVar3->look_nbits[uVar10];
            }
            uVar13 = uVar8 & 0xf;
            if (uVar13 == 0) {
              if (uVar8 >> 4 != 0xf) goto LAB_0023f978;
              iVar7 = iVar7 + 0xf;
            }
            else {
              if ((bits_left < (int)uVar13) &&
                 (bVar5 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,uVar13),
                 get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
                 bits_left = br_state.bits_left, bVar5 == 0)) goto LAB_0023f98f;
              bits_left = bits_left - uVar13;
              uVar9 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[uVar13];
              uVar6 = 0;
              if ((int)uVar9 <= bmask[uVar13 - 1]) {
                uVar6 = bmask[uVar13];
              }
              iVar7 = (uVar8 >> 4) + iVar7;
              (*paJVar2)[jpeg_natural_order[iVar7]] = (short)uVar9 - (short)uVar6;
            }
          }
        }
        for (; iVar7 < 0x40; iVar7 = iVar7 + (uVar8 >> 4) + 1) {
          if (bits_left < 8) {
            bVar5 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar5 == 0) {
              return 0;
            }
            iVar12 = 1;
            get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            bits_left = br_state.bits_left;
            if (7 < br_state.bits_left) goto LAB_0023f7c9;
LAB_0023f7f4:
            uVar8 = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,bits_left,pdVar3,iVar12);
            get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            bits_left = br_state.bits_left;
            if ((int)uVar8 < 0) goto LAB_0023f98f;
          }
          else {
LAB_0023f7c9:
            uVar10 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (pdVar3->look_nbits[uVar10] == 0) {
              iVar12 = 9;
              goto LAB_0023f7f4;
            }
            uVar8 = (uint)pdVar3->look_sym[uVar10];
            bits_left = bits_left - pdVar3->look_nbits[uVar10];
          }
          uVar13 = uVar8 & 0xf;
          if (uVar13 == 0) {
            if (uVar8 >> 4 != 0xf) break;
          }
          else {
            if ((bits_left < (int)uVar13) &&
               (bVar5 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,uVar13),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               bits_left = br_state.bits_left, bVar5 == 0)) goto LAB_0023f98f;
            bits_left = bits_left - uVar13;
          }
        }
LAB_0023f978:
      }
      pjVar4 = cinfo->src;
      pjVar4->next_input_byte = br_state.next_input_byte;
      pjVar4->bytes_in_buffer = br_state.bytes_in_buffer;
      pjVar1[1].start_pass = get_buffer;
      *(int *)&pjVar1[1].decode_mcu = bits_left;
      *(int *)&pjVar1[3].start_pass = state.last_dc_val[3];
      pjVar1[2].start_pass = (_func_void_j_decompress_ptr *)state._0_8_;
      pjVar1[2].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)state.last_dc_val._4_8_
      ;
    }
    bVar5 = 1;
    *(int *)&pjVar1[3].decode_mcu = *(int *)&pjVar1[3].decode_mcu + -1;
  }
  else {
LAB_0023f98f:
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
decode_mcu (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    (*block)[0] = (JCOEF) entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    if (cinfo->lim_Se == 0) continue;
    tbl = compptr->ac_tbl_no;
    k = 0;

    /* Figure F.20: Decode_AC_coefficients */
    do {
      st = entropy->ac_stats[tbl] + 3 * k;
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
      for (;;) {
	k++;
	if (arith_decode(cinfo, st + 1)) break;
	st += 3;
	if (k >= cinfo->lim_Se) {
	  WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	  entropy->ct = -1;			/* spectral overflow */
	  return TRUE;
	}
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	if (arith_decode(cinfo, st)) {
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (arith_decode(cinfo, st)) {
	    if ((m <<= 1) == 0x8000) {
	      WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	      entropy->ct = -1;			/* magnitude overflow */
	      return TRUE;
	    }
	    st += 1;
	  }
	}
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      (*block)[natural_order[k]] = (JCOEF) v;
    } while (k < cinfo->lim_Se);
  }

  return TRUE;
}